

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

DisplayAction * addsetting(DisplayAction *__return_storage_ptr__,string *variable,string *value)

{
  offset_in_Display_to_subr in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"set ",variable);
  std::operator+(&local_78,&local_38," ");
  std::operator+(&local_58,&local_78,value);
  DisplayAction::DisplayAction(__return_storage_ptr__,0,&local_58,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction addsetting( string variable, string value )
{
	return DisplayAction(0, "set " + variable + " " + value, 0, 0, &Display::addUserSetting); 
}